

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O2

void R_DrawSkyPlane(visplane_t *pl)

{
  uint uVar1;
  side_t *psVar2;
  lighttable_t *plVar3;
  FTexture *pFVar4;
  FTextureID texnum;
  float fVar5;
  line_t *plVar6;
  short sVar7;
  long lVar8;
  int iVar9;
  short sVar10;
  int iVar11;
  long lVar12;
  ushort uVar13;
  code *pcVar14;
  FTextureID texnum_00;
  int iVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double __y;
  double local_5a68;
  short bot [5760];
  short top [5760];
  
  plVar6 = lines;
  texnum.texnum = sky2texture.texnum;
  texnum_00.texnum = sky2texture.texnum;
  if ((level.flags & 0x10000004) != 0x10000000) {
    texnum_00.texnum = sky1texture.texnum;
  }
  skymid = skytexturemid;
  skyangle = SUB84(ViewAngle.Degrees * 11930464.711111112 + 6755399441055744.0,0);
  if ((pl->picnum).texnum != skyflatnum.texnum) {
    uVar16 = 0;
    uVar17 = 0;
    local_5a68 = 0.0;
    goto LAB_0032f311;
  }
  uVar1 = pl->sky;
  if ((uVar1 >> 0x1e & 1) != 0) {
    if (uVar1 == 0x40000000) {
      frontskytex = FTextureManager::operator()(&TexMan,sky2texture,true);
      backskytex = (FTexture *)0x0;
      frontcyl = sky2cyl;
      skyflip = 0;
      uVar16 = SUB84(sky2pos,0);
      uVar17 = (undefined4)((ulong)sky2pos >> 0x20);
      local_5a68 = 0.0;
      goto LAB_0032f311;
    }
    psVar2 = lines[((long)(int)uVar1 & 0x1fffffffbfffffffU) - 1].sidedef[0];
    if (((level.flags >> 0x1c & 1) == 0) || (psVar2->textures[2].texture.texnum < 1)) {
      lVar8 = 0;
    }
    else {
      lVar8 = 2;
    }
    frontskytex = FTextureManager::operator()
                            (&TexMan,(FTextureID)psVar2->textures[lVar8].texture.texnum,true);
    if ((frontskytex != (FTexture *)0x0) && (frontskytex->UseType != '\r')) {
      backskytex = (FTexture *)0x0;
      skyangle = skyangle + SUB84(psVar2->textures[lVar8].xOffset + 103079215104.0,0);
      skymid = psVar2->textures[lVar8].yOffset + -28.0;
      skyflip = -(uint)(plVar6[((long)(int)uVar1 & 0x1fffffffbfffffffU) - 1].args[2] == 0);
      frontcyl = (fixed_t)((frontskytex->Scale).X * 1024.0);
      if (frontcyl < (int)(uint)frontskytex->Width) {
        frontcyl = (uint)frontskytex->Width;
      }
      local_5a68 = 0.0;
      if (skystretch == true) {
        skymid = (skymid * 0.0043859649122807015 * (double)frontskytex->Height) /
                 (frontskytex->Scale).Y;
      }
      uVar16 = 0;
      uVar17 = 0;
      goto LAB_0032f311;
    }
  }
  frontskytex = FTextureManager::operator()(&TexMan,texnum_00,true);
  if ((level.flags & 4) == 0) {
    backskytex = (FTexture *)0x0;
  }
  else {
    backskytex = FTextureManager::operator()(&TexMan,texnum,true);
  }
  skyflip = 0;
  uVar16 = SUB84(sky1pos,0);
  uVar17 = (undefined4)((ulong)sky1pos >> 0x20);
  local_5a68 = sky2pos;
  frontcyl = sky1cyl;
  backcyl = sky2cyl;
LAB_0032f311:
  pFVar4 = backskytex;
  dVar19 = fmod((double)CONCAT44(uVar17,uVar16),(double)sky1cyl * 65536.0);
  frontpos = (int)dVar19;
  if (pFVar4 != (FTexture *)0x0) {
    dVar19 = fmod(local_5a68,(double)sky2cyl * 65536.0);
    backpos = (int)dVar19;
  }
  fVar5 = skyiscale;
  plVar3 = fixedcolormap;
  if (fixedcolormap == (lighttable_t *)0x0) {
    fixedcolormap = NormalLight.Maps;
  }
  iVar9 = pl->left;
  lVar8 = (long)iVar9;
  iVar11 = pl->right;
  dc_colormap = fixedcolormap;
  if (iVar9 < iVar11) {
    for (lVar12 = lVar8; iVar11 != lVar12; lVar12 = lVar12 + 1) {
      swall[lVar12] = fVar5;
    }
    if (((byte)MirrorFlags & 1) == 0) {
      iVar9 = iVar9 << 0x10;
      for (; lVar8 < iVar11; lVar8 = lVar8 + 1) {
        lwall[lVar8] = iVar9;
        iVar11 = pl->right;
        iVar9 = iVar9 + 0x10000;
      }
    }
    else {
      iVar9 = viewwidth * 0x10000 + iVar9 * -0x10000;
      for (; lVar8 < iVar11; lVar8 = lVar8 + 1) {
        lwall[lVar8] = iVar9;
        iVar11 = pl->right;
        iVar9 = iVar9 + -0x10000;
      }
    }
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 4) {
      *(undefined4 *)((long)lastskycol + lVar8) = 0xffffffff;
    }
    rw_pic = frontskytex;
    rw_offset = 0;
    dVar19 = (frontskytex->Scale).Y;
    dc_texturemid = skymid * dVar19;
    if (1 << (frontskytex->HeightBits & 0x1f) == (uint)frontskytex->Height) {
      for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 4) {
        *(undefined4 *)((long)lastskycol + lVar8) = 0xffffffff;
      }
      pcVar14 = R_GetTwoSkyColumns;
      if (pFVar4 == (FTexture *)0x0) {
        pcVar14 = R_GetOneSkyColumn;
      }
      wallscan(pl->left,iVar11,(short *)&pl->field_0xda,(short *)pl->bottom,swall,lwall,dVar19,
               pcVar14);
    }
    else {
      dVar19 = dVar19 * skyscale;
      __y = (double)frontskytex->Height;
      dVar20 = (1.0 - CenterY) * (1.0 / dVar19);
      dVar18 = fmod(skymid + dVar20,__y);
      dVar18 = (double)(-(ulong)(dVar18 < 0.0) & (ulong)__y) + dVar18;
      dc_texturemid = dVar18 - dVar20;
      iVar9 = (int)((__y - dVar18) * dVar19);
      iVar11 = 0;
      while (iVar15 = iVar9, sVar7 = (short)iVar11, sVar7 < viewheight) {
        iVar9 = pl->left;
        iVar11 = pl->right;
        for (lVar8 = (long)iVar9; uVar13 = (ushort)iVar15, lVar8 < iVar11; lVar8 = lVar8 + 1) {
          sVar10 = *(short *)(&pl->field_0xda + lVar8 * 2);
          if (*(short *)(&pl->field_0xda + lVar8 * 2) < sVar7) {
            sVar10 = sVar7;
          }
          top[lVar8] = sVar10;
          if ((short)pl->bottom[lVar8] <= (short)uVar13) {
            uVar13 = pl->bottom[lVar8];
          }
          bot[lVar8] = uVar13;
        }
        for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 4) {
          *(undefined4 *)((long)lastskycol + lVar8) = 0xffffffff;
        }
        pcVar14 = R_GetTwoSkyColumns;
        if (backskytex == (FTexture *)0x0) {
          pcVar14 = R_GetOneSkyColumn;
        }
        wallscan(iVar9,iVar11,top,bot,swall,lwall,(rw_pic->Scale).Y,pcVar14);
        dc_texturemid = (double)((short)~uVar13 + centery) * (1.0 / dVar19);
        iVar9 = iVar15 + (int)(dVar19 * __y);
        iVar11 = iVar15;
      }
    }
  }
  if (plVar3 == (lighttable_t *)0x0) {
    fixedcolormap = (lighttable_t *)0x0;
  }
  return;
}

Assistant:

void R_DrawSkyPlane (visplane_t *pl)
{
	FTextureID sky1tex, sky2tex;
	double frontdpos = 0, backdpos = 0;

	if ((level.flags & LEVEL_SWAPSKIES) && !(level.flags & LEVEL_DOUBLESKY))
	{
		sky1tex = sky2texture;
	}
	else
	{
		sky1tex = sky1texture;
	}
	sky2tex = sky2texture;
	skymid = skytexturemid;
	skyangle = ViewAngle.BAMs();

	if (pl->picnum == skyflatnum)
	{
		if (!(pl->sky & PL_SKYFLAT))
		{	// use sky1
		sky1:
			frontskytex = TexMan(sky1tex, true);
			if (level.flags & LEVEL_DOUBLESKY)
				backskytex = TexMan(sky2tex, true);
			else
				backskytex = NULL;
			skyflip = 0;
			frontdpos = sky1pos;
			backdpos = sky2pos;
			frontcyl = sky1cyl;
			backcyl = sky2cyl;
		}
		else if (pl->sky == PL_SKYFLAT)
		{	// use sky2
			frontskytex = TexMan(sky2tex, true);
			backskytex = NULL;
			frontcyl = sky2cyl;
			skyflip = 0;
			frontdpos = sky2pos;
		}
		else
		{	// MBF's linedef-controlled skies
			// Sky Linedef
			const line_t *l = &lines[(pl->sky & ~PL_SKYFLAT)-1];

			// Sky transferred from first sidedef
			const side_t *s = l->sidedef[0];
			int pos;

			// Texture comes from upper texture of reference sidedef
			// [RH] If swapping skies, then use the lower sidedef
			if (level.flags & LEVEL_SWAPSKIES && s->GetTexture(side_t::bottom).isValid())
			{
				pos = side_t::bottom;
			}
			else
			{
				pos = side_t::top;
			}

			frontskytex = TexMan(s->GetTexture(pos), true);
			if (frontskytex == NULL || frontskytex->UseType == FTexture::TEX_Null)
			{ // [RH] The blank texture: Use normal sky instead.
				goto sky1;
			}
			backskytex = NULL;

			// Horizontal offset is turned into an angle offset,
			// to allow sky rotation as well as careful positioning.
			// However, the offset is scaled very small, so that it
			// allows a long-period of sky rotation.
			skyangle += FLOAT2FIXED(s->GetTextureXOffset(pos));

			// Vertical offset allows careful sky positioning.
			skymid = s->GetTextureYOffset(pos) - 28;

			// We sometimes flip the picture horizontally.
			//
			// Doom always flipped the picture, so we make it optional,
			// to make it easier to use the new feature, while to still
			// allow old sky textures to be used.
			skyflip = l->args[2] ? 0u : ~0u;

			int frontxscale = int(frontskytex->Scale.X * 1024);
			frontcyl = MAX(frontskytex->GetWidth(), frontxscale);
			if (skystretch)
			{
				skymid = skymid * frontskytex->GetScaledHeightDouble() / SKYSTRETCH_HEIGHT;
			}
		}
	}
	frontpos = int(fmod(frontdpos, sky1cyl * 65536.0));
	if (backskytex != NULL)
	{
		backpos = int(fmod(backdpos, sky2cyl * 65536.0));
	}

	bool fakefixed = false;
	if (fixedcolormap)
	{
		dc_colormap = fixedcolormap;
	}
	else
	{
		fakefixed = true;
		fixedcolormap = dc_colormap = NormalLight.Maps;
	}

	R_DrawSky (pl);

	if (fakefixed)
		fixedcolormap = NULL;
}